

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

date_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMonthsBinaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t>
          (WidthConvertibleToMonthsBinaryOperator *this,interval_t bucket_width,date_t ts)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  date_t dVar5;
  int right;
  int right_00;
  undefined1 auVar6 [12];
  date_t result;
  date_t local_3c;
  string local_38;
  
  dVar5.days = bucket_width.micros._0_4_;
  bVar1 = Value::IsFinite<duckdb::date_t>(dVar5);
  if (bVar1) {
    iVar2 = EpochMonths<duckdb::date_t>(dVar5);
    right_00 = (int)this;
    right = (int)(0x168 % (long)right_00);
    iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar2,right);
    iVar4 = iVar3 - iVar3 % right_00;
    if (iVar3 % right_00 != 0 && iVar3 < 0) {
      iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar4,right_00);
    }
    iVar4 = iVar4 + right;
    iVar3 = iVar4 % 0xc;
    iVar2 = iVar3 + 1;
    if (iVar3 != 0 && -1 >= iVar4) {
      iVar2 = iVar3 + 0xd;
    }
    dVar5 = Date::FromDate((iVar3 == 0 || -1 < iVar4) + 0x7b1 + iVar4 / 0xc,iVar2,1);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(dVar5,&local_3c,false);
    if (!bVar1) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_38,(duckdb *)(ulong)(uint)dVar5.days,(date_t)auVar6._8_4_);
      InvalidInputException::InvalidInputException(auVar6._0_8_,&local_38);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(dVar5,&local_3c,false);
    if (!bVar1) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_38,(duckdb *)(ulong)(uint)dVar5.days,(date_t)auVar6._8_4_);
      InvalidInputException::InvalidInputException(auVar6._0_8_,&local_38);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (date_t)local_3c.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS));
		}